

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

Float pbrt::SphericalQuadArea(Vector3f a,Vector3f b,Vector3f c,Vector3f d)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Float FVar18;
  Float FVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  float fVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vector3f dxa;
  Vector3f cxd;
  Vector3f bxc;
  Vector3f axb;
  Tuple3<pbrt::Vector3,_float> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Vector3<float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_38;
  
  auVar31._4_60_ = d._12_60_;
  auVar31._0_4_ = d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._8_56_ = d._8_56_;
  auVar30._0_8_ = d.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._4_60_ = c._12_60_;
  auVar29._0_4_ = c.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._8_56_ = c._8_56_;
  auVar27._0_8_ = c.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._4_60_ = b._12_60_;
  auVar26._0_4_ = b.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar23._8_56_ = b._8_56_;
  auVar23._0_8_ = b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._4_60_ = a._12_60_;
  auVar21._0_4_ = a.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._8_56_ = a._8_56_;
  auVar20._0_8_ = a.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15 = auVar20._0_16_;
  auVar14 = auVar21._0_16_;
  auVar8 = auVar26._0_16_;
  auVar11 = vinsertps_avx(auVar14,auVar8,0x10);
  auVar12 = auVar23._0_16_;
  auVar4 = vshufps_avx512vl(auVar12,auVar12,0xe1);
  auVar16 = vshufps_avx(auVar15,auVar15,0xe1);
  auVar17 = vmovshdup_avx(auVar15);
  auVar10 = vmovshdup_avx(auVar12);
  auVar7 = vinsertps_avx512f(auVar4,auVar8,0x10);
  auVar5 = vpermt2ps_avx512vl(auVar15,_DAT_003c76d0,auVar12);
  auVar6 = vpermt2ps_avx512vl(auVar12,_DAT_003c76d0,auVar15);
  auVar9._0_4_ = auVar5._0_4_ * auVar11._0_4_;
  auVar9._4_4_ = auVar5._4_4_ * auVar11._4_4_;
  auVar9._8_4_ = auVar5._8_4_ * auVar11._8_4_;
  auVar9._12_4_ = auVar5._12_4_ * auVar11._12_4_;
  auVar11 = vshufps_avx(auVar11,auVar11,0xe1);
  auVar11 = vfmsub213ps_fma(auVar11,auVar6,auVar9);
  auVar5._4_12_ = auVar16._4_12_;
  auVar5._0_4_ = auVar21._0_4_;
  auVar5 = vfnmadd213ps_fma(auVar7,auVar5,auVar9);
  auVar6 = ZEXT416((uint)(auVar17._0_4_ * b.super_Tuple3<pbrt::Vector3,_float>.x));
  auVar7 = vfmsub213ss_fma(auVar10,auVar15,auVar6);
  auVar6 = vfnmadd231ss_fma(auVar6,auVar17,auVar12);
  auVar33._0_4_ = auVar11._0_4_ + auVar5._0_4_;
  auVar33._4_4_ = auVar11._4_4_ + auVar5._4_4_;
  auVar33._8_4_ = auVar11._8_4_ + auVar5._8_4_;
  auVar33._12_4_ = auVar11._12_4_ + auVar5._12_4_;
  auVar13._0_4_ = auVar33._0_4_ * auVar33._0_4_;
  auVar13._4_4_ = auVar33._4_4_ * auVar33._4_4_;
  auVar13._8_4_ = auVar33._8_4_ * auVar33._8_4_;
  auVar13._12_4_ = auVar33._12_4_ * auVar33._12_4_;
  local_38.z = auVar7._0_4_ + auVar6._0_4_;
  auVar11 = vhaddps_avx(auVar13,auVar13);
  fVar22 = local_38.z * local_38.z + auVar11._0_4_;
  auVar11._0_12_ = ZEXT812(0);
  auVar11._12_4_ = 0;
  if ((fVar22 != 0.0) || (NAN(fVar22))) {
    auVar13 = auVar27._0_16_;
    auVar7 = vpermt2ps_avx512vl(auVar12,_DAT_003c76d0,auVar13);
    auVar28 = auVar29._0_16_;
    auVar11 = vinsertps_avx512f(auVar8,auVar28,0x10);
    auVar5 = vpermt2ps_avx512vl(auVar13,_DAT_003c76d0,auVar12);
    auVar6._4_12_ = auVar4._4_12_;
    auVar6._0_4_ = auVar26._0_4_;
    auVar4 = vmovshdup_avx512vl(auVar13);
    auVar8 = vshufps_avx512vl(auVar11,auVar11,0xe1);
    auVar7 = vmulps_avx512vl(auVar7,auVar11);
    auVar9 = vshufps_avx512vl(auVar13,auVar13,0xe1);
    auVar11 = vinsertps_avx512f(auVar9,auVar28,0x10);
    auVar5 = vfmsub213ps_avx512vl(auVar8,auVar5,auVar7);
    auVar7 = vfnmadd213ps_avx512vl(auVar11,auVar6,auVar7);
    auVar11 = ZEXT416((uint)(auVar10._0_4_ * c.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar6 = vfmsub213ss_avx512f(auVar12,auVar4,auVar11);
    auVar11 = vfnmadd213ss_fma(auVar10,auVar13,auVar11);
    auVar10 = vaddps_avx512vl(auVar5,auVar7);
    auVar7._0_4_ = auVar10._0_4_ * auVar10._0_4_;
    auVar7._4_4_ = auVar10._4_4_ * auVar10._4_4_;
    auVar7._8_4_ = auVar10._8_4_ * auVar10._8_4_;
    auVar7._12_4_ = auVar10._12_4_ * auVar10._12_4_;
    fVar1 = auVar11._0_4_ + auVar6._0_4_;
    auVar11 = vhaddps_avx(auVar7,auVar7);
    fVar2 = fVar1 * fVar1 + auVar11._0_4_;
    auVar11 = ZEXT816(0) << 0x20;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      auVar24 = auVar30._0_16_;
      auVar5 = vpermt2ps_avx512vl(auVar13,_DAT_003c76d0,auVar24);
      auVar25 = auVar31._0_16_;
      auVar11 = vinsertps_avx512f(auVar28,auVar25,0x10);
      auVar6 = vpermt2ps_avx512vl(auVar24,_DAT_003c76d0,auVar13);
      auVar12._4_12_ = auVar9._4_12_;
      auVar12._0_4_ = auVar29._0_4_;
      auVar8 = vshufps_avx512vl(auVar24,auVar24,0xe1);
      auVar9 = vmovshdup_avx512vl(auVar24);
      auVar7 = vinsertps_avx512f(auVar8,auVar25,0x10);
      auVar5 = vmulps_avx512vl(auVar5,auVar11);
      auVar11 = vshufps_avx512vl(auVar11,auVar11,0xe1);
      auVar11 = vfmsub213ps_avx512vl(auVar11,auVar6,auVar5);
      auVar7 = vfnmadd213ps_avx512vl(auVar7,auVar12,auVar5);
      auVar5 = vmulss_avx512f(auVar4,auVar24);
      auVar6 = vfmsub213ss_avx512f(auVar13,auVar9,auVar5);
      auVar5 = vfnmadd213ss_avx512f(auVar4,auVar24,auVar5);
      auVar4 = vaddps_avx512vl(auVar11,auVar7);
      auVar28._0_4_ = auVar4._0_4_ * auVar4._0_4_;
      auVar28._4_4_ = auVar4._4_4_ * auVar4._4_4_;
      auVar28._8_4_ = auVar4._8_4_ * auVar4._8_4_;
      auVar28._12_4_ = auVar4._12_4_ * auVar4._12_4_;
      auVar5 = vaddss_avx512f(auVar6,auVar5);
      auVar11 = vhaddps_avx(auVar28,auVar28);
      auVar7 = vmulss_avx512f(auVar5,auVar5);
      vaddss_avx512f(auVar7,auVar11);
      auVar11 = ZEXT816(0) << 0x20;
      auVar7 = vucomiss_avx512f(auVar11);
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        auVar12 = vpermt2ps_avx512vl(auVar24,_DAT_003c76d0,auVar15);
        auVar6 = vinsertps_avx512f(auVar25,auVar14,0x10);
        auVar13 = vpermi2ps_avx512vl(_DAT_003c76d0,auVar15,auVar24);
        auVar8._0_4_ = auVar31._0_4_;
        auVar11 = vinsertps_avx(auVar16,auVar14,0x10);
        auVar14 = vmulps_avx512vl(auVar12,auVar6);
        auVar6 = vshufps_avx512vl(auVar6,auVar6,0xe1);
        auVar16 = vfnmadd213ps_fma(auVar11,auVar8,auVar14);
        auVar6 = vfmsub213ps_avx512vl(auVar6,auVar13,auVar14);
        auVar14 = vmulss_avx512f(auVar15,auVar9);
        auVar11 = ZEXT816(0) << 0x20;
        auVar17 = vfmsub213ss_fma(auVar17,auVar24,auVar14);
        auVar15 = vfnmadd213ss_avx512f(auVar15,auVar9,auVar14);
        auVar16 = vaddps_avx512vl(auVar6,auVar16);
        auVar14._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar14._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar14._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar14._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        local_68.super_Tuple3<pbrt::Vector3,_float>.z = auVar17._0_4_ + auVar15._0_4_;
        auVar17 = vhaddps_avx(auVar14,auVar14);
        fVar3 = local_68.super_Tuple3<pbrt::Vector3,_float>.z *
                local_68.super_Tuple3<pbrt::Vector3,_float>.z + auVar17._0_4_;
        if ((fVar3 != 0.0) || (NAN(fVar3))) {
          auVar11 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
          auVar17 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
          fVar22 = auVar11._0_4_;
          auVar32._4_4_ = fVar22;
          auVar32._0_4_ = fVar22;
          auVar32._8_4_ = fVar22;
          auVar32._12_4_ = fVar22;
          local_38.z = local_38.z / fVar22;
          fVar22 = auVar17._0_4_;
          auVar34._4_4_ = fVar22;
          auVar34._0_4_ = fVar22;
          auVar34._8_4_ = fVar22;
          auVar34._12_4_ = fVar22;
          local_88._0_4_ = fVar1 / fVar22;
          local_88._4_12_ = SUB6012((undefined1  [60])0x0,0);
          local_a8 = vdivps_avx(auVar10,auVar34);
          auVar11 = vdivps_avx(auVar33,auVar32);
          local_48._0_8_ = vmovlps_avx(local_a8);
          auVar17 = vsqrtss_avx512f(auVar7,auVar7);
          local_38._0_8_ = vmovlps_avx(auVar11);
          fVar22 = auVar17._0_4_;
          auVar24._4_4_ = fVar22;
          auVar24._0_4_ = fVar22;
          auVar24._8_4_ = fVar22;
          auVar24._12_4_ = fVar22;
          local_78._0_4_ = auVar5._0_4_ / fVar22;
          local_78._4_12_ = auVar5._4_12_;
          local_98 = vdivps_avx(auVar4,auVar24);
          local_58._0_8_ = vmovlps_avx(local_98);
          auVar17 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
          fVar22 = auVar17._0_4_;
          auVar25._4_4_ = fVar22;
          auVar25._0_4_ = fVar22;
          auVar25._8_4_ = fVar22;
          auVar25._12_4_ = fVar22;
          local_68.super_Tuple3<pbrt::Vector3,_float>.z =
               local_68.super_Tuple3<pbrt::Vector3,_float>.z / fVar22;
          auVar17 = vdivps_avx(auVar16,auVar25);
          local_68.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
          auVar10._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
          auVar10._8_4_ = auVar11._8_4_ ^ 0x80000000;
          auVar10._12_4_ = auVar11._12_4_ ^ 0x80000000;
          local_b8.z = -local_38.z;
          local_b8._0_8_ = vmovlps_avx(auVar10);
          local_58.z = (float)local_78._0_4_;
          local_48.z = (float)local_88._0_4_;
          FVar18 = AngleBetween<float>(&local_68,(Vector3<float> *)&local_b8);
          auVar16._0_8_ = local_a8._0_8_ ^ 0x8000000080000000;
          auVar16._8_4_ = local_a8._8_4_ ^ 0x80000000;
          auVar16._12_4_ = local_a8._12_4_ ^ 0x80000000;
          local_b8.z = -(float)local_88._0_4_;
          local_b8._0_8_ = vmovlps_avx(auVar16);
          FVar19 = AngleBetween<float>((Vector3<float> *)&local_38,(Vector3<float> *)&local_b8);
          local_a8._0_4_ = FVar19;
          auVar4._0_8_ = local_98._0_8_ ^ 0x8000000080000000;
          auVar4._8_4_ = local_98._8_4_ ^ 0x80000000;
          auVar4._12_4_ = local_98._12_4_ ^ 0x80000000;
          local_b8.z = -(float)local_78._0_4_;
          local_b8._0_8_ = vmovlps_avx(auVar4);
          FVar19 = AngleBetween<float>((Vector3<float> *)&local_48,(Vector3<float> *)&local_b8);
          local_98._0_4_ = FVar19;
          auVar15._0_8_ = local_68.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
          auVar15._8_4_ = 0x80000000;
          auVar15._12_4_ = 0x80000000;
          local_b8.z = -local_68.super_Tuple3<pbrt::Vector3,_float>.z;
          local_b8._0_8_ = vmovlps_avx(auVar15);
          FVar19 = AngleBetween<float>((Vector3<float> *)&local_58,(Vector3<float> *)&local_b8);
          auVar17._8_4_ = 0x7fffffff;
          auVar17._0_8_ = 0x7fffffff7fffffff;
          auVar17._12_4_ = 0x7fffffff;
          auVar11 = vandps_avx512vl(ZEXT416((uint)((float)local_a8._0_4_ + FVar18 +
                                                   (float)local_98._0_4_ + FVar19 + -6.2831855)),
                                    auVar17);
        }
      }
    }
  }
  return auVar11._0_4_;
}

Assistant:

PBRT_CPU_GPU inline auto DifferenceOfProducts(Ta a, Tb b, Tc c, Td d) {
    auto cd = c * d;
    auto differenceOfProducts = FMA(a, b, -cd);
    auto error = FMA(-c, d, cd);
    return differenceOfProducts + error;
}